

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObjectManager::Shutdown(CSharedMemoryObjectManager *this,CPalThread *pthr)

{
  PLIST_ENTRY p_Var1;
  _LIST_ENTRY *p_Var2;
  _LIST_ENTRY *p_Var3;
  CSharedMemoryObject *pCVar4;
  PLIST_ENTRY _EX_Flink_1;
  PLIST_ENTRY _EX_Blink_1;
  PLIST_ENTRY _EX_Flink;
  PLIST_ENTRY _EX_Blink;
  CSharedMemoryObject *pshmobj;
  PLIST_ENTRY ple;
  CPalThread *pthr_local;
  CSharedMemoryObjectManager *this_local;
  
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","Shutdown",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x61);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  InternalEnterCriticalSection(pthr,&this->m_csListLock);
  SHMLock();
  while ((this->m_leAnonymousObjects).Flink != &this->m_leAnonymousObjects) {
    p_Var1 = (this->m_leAnonymousObjects).Blink;
    p_Var2 = ((this->m_leAnonymousObjects).Blink)->Flink;
    p_Var3 = ((this->m_leAnonymousObjects).Blink)->Blink;
    p_Var3->Flink = p_Var2;
    p_Var2->Blink = p_Var3;
    pCVar4 = CSharedMemoryObject::GetObjectFromListLink(p_Var1);
    CSharedMemoryObject::CleanupForProcessShutdown(pCVar4,pthr);
  }
  while ((this->m_leNamedObjects).Flink != &this->m_leNamedObjects) {
    p_Var1 = (this->m_leNamedObjects).Blink;
    p_Var2 = ((this->m_leNamedObjects).Blink)->Flink;
    p_Var3 = ((this->m_leNamedObjects).Blink)->Blink;
    p_Var3->Flink = p_Var2;
    p_Var2->Blink = p_Var3;
    pCVar4 = CSharedMemoryObject::GetObjectFromListLink(p_Var1);
    CSharedMemoryObject::CleanupForProcessShutdown(pCVar4,pthr);
  }
  SHMRelease();
  InternalLeaveCriticalSection(pthr,&this->m_csListLock);
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return 0;
  }
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObjectManager::Shutdown(
    CPalThread *pthr
    )
{
    PLIST_ENTRY ple;
    CSharedMemoryObject *pshmobj;

    _ASSERTE(NULL != pthr);
    
    ENTRY("CSharedMemoryObjectManager::Shutdown (this=%p, pthr=%p)\n",
        this,
        pthr
        );

    InternalEnterCriticalSection(pthr, &m_csListLock);
    SHMLock();

    while (!IsListEmpty(&m_leAnonymousObjects))
    {
        ple = RemoveTailList(&m_leAnonymousObjects);
        pshmobj = CSharedMemoryObject::GetObjectFromListLink(ple);
        pshmobj->CleanupForProcessShutdown(pthr);
    }

    while (!IsListEmpty(&m_leNamedObjects))
    {
        ple = RemoveTailList(&m_leNamedObjects);
        pshmobj = CSharedMemoryObject::GetObjectFromListLink(ple);
        pshmobj->CleanupForProcessShutdown(pthr);
    }

    SHMRelease();
    InternalLeaveCriticalSection(pthr, &m_csListLock);

    LOGEXIT("CSharedMemoryObjectManager::Shutdown returns %d\n", NO_ERROR);
    
    return NO_ERROR;
}